

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollLocation location,bool active)

{
  bool bVar1;
  qsizetype qVar2;
  QRect *this_00;
  byte in_DL;
  int in_ESI;
  QMenuPrivate *in_RDI;
  undefined1 unaff_retaddr;
  SelectionReason in_stack_00000008;
  int in_stack_0000000c;
  QMenuPrivate *in_stack_00000010;
  QAction *act_1;
  int i_1;
  QAction *act;
  int i;
  QAction *in_stack_00000058;
  bool in_stack_00000083;
  ScrollLocation in_stack_00000084;
  QAction *in_stack_00000088;
  QMenuPrivate *in_stack_00000090;
  QMenuPrivate *in_stack_ffffffffffffffb8;
  QRect *in_stack_ffffffffffffffc0;
  int local_24;
  int local_14;
  
  updateActionRects(in_stack_ffffffffffffffb8);
  if (in_ESI == 1) {
    qVar2 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    local_14 = (int)qVar2;
    do {
      do {
        local_14 = local_14 + -1;
        if (local_14 < 0) {
          return;
        }
        QList<QRect>::at((QList<QRect> *)in_stack_ffffffffffffffc0,
                         (qsizetype)in_stack_ffffffffffffffb8);
        bVar1 = QRect::isNull(in_stack_ffffffffffffffc0);
      } while (bVar1);
      QList<QAction_*>::at
                ((QList<QAction_*> *)in_stack_ffffffffffffffc0,(qsizetype)in_stack_ffffffffffffffb8)
      ;
      bVar1 = considerAction(in_RDI,(QAction *)in_stack_ffffffffffffffc0);
    } while (!bVar1);
    if ((in_RDI->scroll->scrollFlags & 2) == 0) {
      if ((in_DL & 1) != 0) {
        setCurrentAction(in_stack_00000010,in_stack_00000058,in_stack_0000000c,in_stack_00000008,
                         (bool)unaff_retaddr);
      }
    }
    else {
      scrollMenu(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000083);
    }
  }
  else if (in_ESI == 2) {
    local_24 = 0;
    while( true ) {
      this_00 = (QRect *)(long)local_24;
      qVar2 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
      if (qVar2 <= (long)this_00) break;
      QList<QRect>::at((QList<QRect> *)this_00,(qsizetype)in_stack_ffffffffffffffb8);
      bVar1 = QRect::isNull(this_00);
      if (!bVar1) {
        QList<QAction_*>::at((QList<QAction_*> *)this_00,(qsizetype)in_stack_ffffffffffffffb8);
        bVar1 = considerAction(in_RDI,(QAction *)this_00);
        if (bVar1) {
          if ((in_RDI->scroll->scrollFlags & 1) != 0) {
            scrollMenu(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000083);
            return;
          }
          if ((in_DL & 1) == 0) {
            return;
          }
          setCurrentAction(in_stack_00000010,in_stack_00000058,in_stack_0000000c,in_stack_00000008,
                           (bool)unaff_retaddr);
          return;
        }
      }
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollLocation location, bool active)
{
    updateActionRects();
    if (location == QMenuScroller::ScrollBottom) {
        for(int i = actions.size()-1; i >= 0; --i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollBottom, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    } else if (location == QMenuScroller::ScrollTop) {
        for(int i = 0; i < actions.size(); ++i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollTop, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    }
}